

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  int iVar1;
  char *value_00;
  size_t __n;
  void *pvVar2;
  size_t len;
  char *value;
  json_t *json;
  json_error_t *error_local;
  size_t flags_local;
  lex_t *lex_local;
  
  lex->depth = lex->depth + 1;
  if (lex->depth < 0x801) {
    iVar1 = lex->token;
    if (iVar1 == -1) {
      error_set(error,lex,json_error_invalid_syntax,"invalid token");
      lex_local = (lex_t *)0x0;
    }
    else {
      if (iVar1 == 0x5b) {
        value = (char *)parse_array(lex,flags,error);
      }
      else if (iVar1 == 0x7b) {
        value = (char *)parse_object(lex,flags,error);
      }
      else if (iVar1 == 0x100) {
        value_00 = (lex->value).string.val;
        __n = (lex->value).string.len;
        if (((flags & 0x10) == 0) && (pvVar2 = memchr(value_00,0,__n), pvVar2 != (void *)0x0)) {
          error_set(error,lex,json_error_null_character,
                    "\\u0000 is not allowed without JSON_ALLOW_NUL");
          return (json_t *)0x0;
        }
        value = (char *)jsonp_stringn_nocheck_own(value_00,__n);
        (lex->value).string.val = (char *)0x0;
        (lex->value).string.len = 0;
      }
      else if (iVar1 == 0x101) {
        value = (char *)json_integer((lex->value).integer);
      }
      else if (iVar1 == 0x102) {
        value = (char *)json_real((lex->value).real);
      }
      else if (iVar1 == 0x103) {
        value = (char *)json_true();
      }
      else if (iVar1 == 0x104) {
        value = (char *)json_false();
      }
      else {
        if (iVar1 != 0x105) {
          error_set(error,lex,json_error_invalid_syntax,"unexpected token");
          return (json_t *)0x0;
        }
        value = (char *)json_null();
      }
      if (value == (char *)0x0) {
        lex_local = (lex_t *)0x0;
      }
      else {
        lex->depth = lex->depth - 1;
        lex_local = (lex_t *)value;
      }
    }
  }
  else {
    error_set(error,lex,json_error_stack_overflow,"maximum parsing depth reached");
    lex_local = (lex_t *)0x0;
  }
  return (json_t *)lex_local;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error) {
    json_t *json;

    lex->depth++;
    if (lex->depth > JSON_PARSER_MAX_DEPTH) {
        error_set(error, lex, json_error_stack_overflow, "maximum parsing depth reached");
        return NULL;
    }

    switch (lex->token) {
        case TOKEN_STRING: {
            const char *value = lex->value.string.val;
            size_t len = lex->value.string.len;

            if (!(flags & JSON_ALLOW_NUL)) {
                if (memchr(value, '\0', len)) {
                    error_set(error, lex, json_error_null_character,
                              "\\u0000 is not allowed without JSON_ALLOW_NUL");
                    return NULL;
                }
            }

            json = jsonp_stringn_nocheck_own(value, len);
            lex->value.string.val = NULL;
            lex->value.string.len = 0;
            break;
        }

        case TOKEN_INTEGER: {
            json = json_integer(lex->value.integer);
            break;
        }

        case TOKEN_REAL: {
            json = json_real(lex->value.real);
            break;
        }

        case TOKEN_TRUE:
            json = json_true();
            break;

        case TOKEN_FALSE:
            json = json_false();
            break;

        case TOKEN_NULL:
            json = json_null();
            break;

        case '{':
            json = parse_object(lex, flags, error);
            break;

        case '[':
            json = parse_array(lex, flags, error);
            break;

        case TOKEN_INVALID:
            error_set(error, lex, json_error_invalid_syntax, "invalid token");
            return NULL;

        default:
            error_set(error, lex, json_error_invalid_syntax, "unexpected token");
            return NULL;
    }

    if (!json)
        return NULL;

    lex->depth--;
    return json;
}